

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O2

void FileUtil::readSparseMatrixLocally
               (SparseMatrix *R,SparseMatrix *Rt,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *user_item_R,
               unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
               *item_user_R,int start_user_id,int end_user_id,int start_item_id,int end_item_id)

{
  int iVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *pvVar5;
  int iVar6;
  long lVar7;
  int idx;
  long lVar8;
  int local_5c;
  _Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_58;
  int local_34;
  
  local_34 = end_user_id;
  while (start_user_id < local_34) {
    local_5c = start_user_id;
    iVar3 = std::
            _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&user_item_R->_M_h,&local_5c);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)user_item_R,&local_5c);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
                (pmVar4,&local_58);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_58);
    }
    lVar7 = (long)local_5c;
    iVar2 = Rt->ccs_col_ptr[lVar7 + 1];
    iVar1 = Rt->ccs_col_ptr[lVar7];
    lVar8 = (long)iVar1;
    iVar6 = local_5c;
    if (iVar2 != iVar1) {
      for (; iVar6 = (int)lVar7, lVar8 < iVar2; lVar8 = lVar8 + 1) {
        pvVar5 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)user_item_R,&local_5c);
        local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)Rt->ccs_rating_scores[lVar8];
        local_58._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                               Rt->ccs_row_idx[lVar8]);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>(pvVar5,(pair<int,_double> *)&local_58);
        lVar7 = (long)local_5c;
        iVar2 = Rt->ccs_col_ptr[lVar7 + 1];
      }
    }
    start_user_id = iVar6 + 1;
  }
  while (start_item_id < end_item_id) {
    local_5c = start_item_id;
    iVar3 = std::
            _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&item_user_R->_M_h,&local_5c);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)item_user_R,&local_5c);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
                (pmVar4,(pair<int,_double> *)&local_58);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_58);
    }
    lVar7 = (long)local_5c;
    iVar2 = R->ccs_col_ptr[lVar7 + 1];
    iVar1 = R->ccs_col_ptr[lVar7];
    lVar8 = (long)iVar1;
    iVar6 = local_5c;
    if (iVar2 != iVar1) {
      for (; iVar6 = (int)lVar7, lVar8 < iVar2; lVar8 = lVar8 + 1) {
        pvVar5 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)item_user_R,&local_5c);
        local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)R->ccs_rating_scores[lVar8];
        local_58._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                               R->ccs_row_idx[lVar8]);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>(pvVar5,(pair<int,_double> *)&local_58);
        lVar7 = (long)local_5c;
        iVar2 = R->ccs_col_ptr[lVar7 + 1];
      }
    }
    start_item_id = iVar6 + 1;
  }
  return;
}

Assistant:

void readSparseMatrixLocally(const SparseMatrix &R, const SparseMatrix &Rt, unordered_map<int, vector<pair<int, value_type > > > &user_item_R,
                                 unordered_map<int, vector<pair<int, value_type > > > &item_user_R,
                                 const int start_user_id, const int end_user_id, const int start_item_id,
                                 const int end_item_id) {

        for (int user_id = start_user_id; user_id < end_user_id; user_id++) {

            if(user_item_R.find(user_id)==user_item_R.end()){
                user_item_R[user_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (Rt.ccs_col_ptr[user_id + 1] == Rt.ccs_col_ptr[user_id]) {
                continue;
            }

            for (int idx = Rt.ccs_col_ptr[user_id]; idx < Rt.ccs_col_ptr[user_id + 1]; idx++) {
                user_item_R[user_id].push_back(std::make_pair(Rt.ccs_row_idx[idx], Rt.ccs_rating_scores[idx]));
            }
        }

        for (int item_id = start_item_id; item_id < end_item_id; item_id++) {

            if(item_user_R.find(item_id)==item_user_R.end()){
                item_user_R[item_id] = vector<pair<int, value_type > >();
            }

            // empty column
            if (R.ccs_col_ptr[item_id + 1] == R.ccs_col_ptr[item_id]) {
                continue;
            }

            for (int idx = R.ccs_col_ptr[item_id]; idx < R.ccs_col_ptr[item_id + 1]; idx++) {
                item_user_R[item_id].push_back(std::make_pair(R.ccs_row_idx[idx], R.ccs_rating_scores[idx]));
            }
        }

    }